

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardShapes.cpp
# Opt level: O0

void Assimp::Subdivide(vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *positions)

{
  float fVar1;
  reference pvVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  aiVector3t<float> *paVar6;
  float f;
  aiVector3t<float> aVar7;
  value_type local_f0;
  aiVector3t<float> local_e0;
  undefined1 local_d4 [8];
  aiVector3D v3;
  float local_c0;
  aiVector3t<float> local_b4;
  undefined1 local_a8 [8];
  aiVector3D v2;
  float fStack_94;
  float local_90;
  aiVector3t<float> local_84;
  undefined1 local_78 [8];
  aiVector3D v1;
  float fStack_64;
  aiVector3D c;
  float fStack_54;
  aiVector3D b;
  float fStack_44;
  aiVector3D a;
  aiVector3D *tv2;
  aiVector3D *tv1;
  aiVector3D *tv0;
  uint i;
  uint origSize;
  ai_real fl1;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *positions_local;
  
  pvVar2 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                     (positions,0);
  f = aiVector3t<float>::Length(pvVar2);
  sVar3 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size(positions);
  for (tv0._4_4_ = 0; tv0._4_4_ < (uint)sVar3; tv0._4_4_ = tv0._4_4_ + 3) {
    pvVar2 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                       (positions,(ulong)tv0._4_4_);
    pvVar4 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                       (positions,(ulong)(tv0._4_4_ + 1));
    pvVar5 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                       (positions,(ulong)(tv0._4_4_ + 2));
    fVar1 = pvVar2->z;
    b.z = pvVar2->x;
    fStack_44 = pvVar2->y;
    b.x = pvVar4->z;
    c.z = pvVar4->x;
    fStack_54 = pvVar4->y;
    c.x = pvVar5->z;
    v1.z = pvVar5->x;
    fStack_64 = pvVar5->y;
    aiVector3t<float>::aiVector3t(&local_84,b.z + c.z,fStack_44 + fStack_54,fVar1 + b.x);
    paVar6 = aiVector3t<float>::Normalize(&local_84);
    aVar7 = ::operator*(paVar6,f);
    local_90 = aVar7.z;
    v1.x = local_90;
    stack0xffffffffffffff68 = aVar7._0_8_;
    local_78._0_4_ = v2.z;
    local_78._4_4_ = fStack_94;
    unique0x100002dd = aVar7;
    aiVector3t<float>::aiVector3t(&local_b4,b.z + v1.z,fStack_44 + fStack_64,fVar1 + c.x);
    paVar6 = aiVector3t<float>::Normalize(&local_b4);
    aVar7 = ::operator*(paVar6,f);
    local_c0 = aVar7.z;
    v2.x = local_c0;
    v3._4_8_ = aVar7._0_8_;
    local_a8._0_4_ = v3.y;
    local_a8._4_4_ = v3.z;
    unique0x100002d1 = aVar7;
    aiVector3t<float>::aiVector3t(&local_e0,c.z + v1.z,fStack_54 + fStack_64,b.x + c.x);
    paVar6 = aiVector3t<float>::Normalize(&local_e0);
    aVar7 = ::operator*(paVar6,f);
    local_f0._0_8_ = aVar7._0_8_;
    local_d4._0_4_ = local_f0.x;
    local_d4._4_4_ = local_f0.y;
    local_f0.z = aVar7.z;
    v3.x = local_f0.z;
    pvVar2->x = (float)local_78._0_4_;
    pvVar2->y = (float)local_78._4_4_;
    pvVar2->z = v1.x;
    pvVar4->x = local_f0.x;
    pvVar4->y = local_f0.y;
    pvVar4->z = local_f0.z;
    pvVar5->x = (float)local_a8._0_4_;
    pvVar5->y = (float)local_a8._4_4_;
    pvVar5->z = v2.x;
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)local_78);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)local_a8);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)&b.z);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)local_a8);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)local_d4);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)&v1.z);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)local_d4);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)local_78);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,(value_type *)&c.z);
  }
  return;
}

Assistant:

void Subdivide(std::vector<aiVector3D>& positions)
{
    // assume this to be constant - (fixme: must be 1.0? I think so)
    const ai_real fl1 = positions[0].Length();

    unsigned int origSize = (unsigned int)positions.size();
    for (unsigned int i = 0 ; i < origSize ; i+=3)
    {
        aiVector3D& tv0 = positions[i];
        aiVector3D& tv1 = positions[i+1];
        aiVector3D& tv2 = positions[i+2];

        aiVector3D a = tv0, b = tv1, c = tv2;
        aiVector3D v1 = aiVector3D(a.x+b.x, a.y+b.y, a.z+b.z).Normalize()*fl1;
        aiVector3D v2 = aiVector3D(a.x+c.x, a.y+c.y, a.z+c.z).Normalize()*fl1;
        aiVector3D v3 = aiVector3D(b.x+c.x, b.y+c.y, b.z+c.z).Normalize()*fl1;

        tv0 = v1; tv1 = v3; tv2 = v2; // overwrite the original
        ADD_TRIANGLE(v1, v2, a);
        ADD_TRIANGLE(v2, v3, c);
        ADD_TRIANGLE(v3, v1, b);
    }
}